

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O2

Aig_Man_t * Aig_ManDupSimpleWithHints(Aig_Man_t *p,Vec_Int_t *vHints)

{
  uint uVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int iVar6;
  
  if ((p->nAsserts != 0) && (p->nConstrs != 0)) {
    __assert_fail("p->nAsserts == 0 || p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                  ,0x70,"Aig_Man_t *Aig_ManDupSimpleWithHints(Aig_Man_t *, Vec_Int_t *)");
  }
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar6);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
    uVar1 = Vec_IntEntry(vHints,*(int *)((long)pvVar3 + 0x24));
    if (uVar1 < 2) {
      *(ulong *)((long)pvVar3 + 0x28) = (ulong)uVar1 ^ (ulong)p_00->pConst1;
    }
  }
  for (iVar6 = 0; iVar6 < p->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar6);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      p1 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p_00,pAVar5,p1);
      (pAVar4->field_5).pData = pAVar5;
      uVar1 = Vec_IntEntry(vHints,pAVar4->Id);
      if (uVar1 < 2) {
        (pAVar4->field_5).pData = (void *)((ulong)uVar1 ^ (ulong)p_00->pConst1);
      }
    }
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar6);
    pAVar5 = Aig_ObjChild0Copy(pAVar4);
    pAVar5 = Aig_ObjCreateCo(p_00,pAVar5);
    (pAVar4->field_5).pData = pAVar5;
  }
  Aig_ManCleanup(p_00);
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar6 = Aig_ManCheck(p_00);
  if (iVar6 == 0) {
    puts("Llb_ManDeriveAigWithHints(): The check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupSimpleWithHints( Aig_Man_t * p, Vec_Int_t * vHints )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i, Entry;
    assert( p->nAsserts == 0 || p->nConstrs == 0 );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pNew );
        Entry = Vec_IntEntry( vHints, Aig_ObjId(pObj) );
        if ( Entry == 0 || Entry == 1 )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pNew), Entry ); // restrict to the complement of constraint!!!
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Entry = Vec_IntEntry( vHints, Aig_ObjId(pObj) );
        if ( Entry == 0 || Entry == 1 )
            pObj->pData = Aig_NotCond( Aig_ManConst1(pNew), Entry ); // restrict to the complement of constraint!!!
    }
    // add the POs
    Aig_ManForEachCo( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Llb_ManDeriveAigWithHints(): The check has failed.\n" );
    return pNew;
}